

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O0

bool __thiscall jbcoin::Serializer::getVLLength(Serializer *this,int *length,int offset)

{
  bool bVar1;
  int iVar2;
  exception *anon_var_0;
  int b3;
  int b2_1;
  int b2;
  int local_2c;
  int local_28;
  int lenLen;
  int b1;
  int offset_local;
  int *length_local;
  Serializer *this_local;
  
  lenLen = offset + 1;
  _b1 = length;
  length_local = (int *)this;
  bVar1 = get8(this,&local_28,offset);
  if (!bVar1) {
    return false;
  }
  local_2c = decodeLengthLength(local_28);
  iVar2 = lenLen;
  if (local_2c == 1) {
    iVar2 = decodeVLLength(local_28);
    *_b1 = iVar2;
  }
  else if (local_2c == 2) {
    lenLen = lenLen + 1;
    bVar1 = get8(this,&b3,iVar2);
    if (!bVar1) {
      return false;
    }
    iVar2 = decodeVLLength(local_28,b3);
    *_b1 = iVar2;
  }
  else {
    if (local_2c != 3) {
      return false;
    }
    lenLen = lenLen + 1;
    bVar1 = get8(this,(int *)((long)&anon_var_0 + 4),iVar2);
    iVar2 = lenLen;
    if (!bVar1) {
      return false;
    }
    lenLen = lenLen + 1;
    bVar1 = get8(this,(int *)&anon_var_0,iVar2);
    if (!bVar1) {
      return false;
    }
    iVar2 = decodeVLLength(local_28,anon_var_0._4_4_,(int)anon_var_0);
    *_b1 = iVar2;
  }
  return true;
}

Assistant:

bool Serializer::getVLLength (int& length, int offset) const
{
    int b1;

    if (!get8 (b1, offset++)) return false;

    int lenLen = decodeLengthLength (b1);

    try
    {
        if (lenLen == 1)
            length = decodeVLLength (b1);
        else if (lenLen == 2)
        {
            int b2;

            if (!get8 (b2, offset++)) return false;

            length = decodeVLLength (b1, b2);
        }
        else if (lenLen == 3)
        {
            int b2, b3;

            if (!get8 (b2, offset++)) return false;

            if (!get8 (b3, offset++)) return false;

            length = decodeVLLength (b1, b2, b3);
        }
        else return false;
    }
    catch (std::exception const&)
    {
        return false;
    }

    return true;
}